

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplImpl.h
# Opt level: O2

void __thiscall
celero::Pimpl<celero::Experiment::Impl>::Pimpl<std::weak_ptr<celero::Benchmark>&>
          (Pimpl<celero::Experiment::Impl> *this,weak_ptr<celero::Benchmark> *arg1)

{
  _Head_base<0UL,_celero::Experiment::Impl_*,_false> this_00;
  __weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00._M_head_impl = (Impl *)operator_new(0x90);
  std::__weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&local_30,&arg1->super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>);
  Experiment::Impl::Impl(this_00._M_head_impl,(weak_ptr<celero::Benchmark> *)&local_30);
  (this->_pimpl)._M_t.
  super___uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
  .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl = this_00._M_head_impl;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_30._M_refcount);
  return;
}

Assistant:

Pimpl<T>::Pimpl(Arg1&& arg1) : _pimpl(new T(std::forward<Arg1>(arg1)))
	{
	}